

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.hh
# Opt level: O0

void __thiscall
QPDFParser::QPDFParser
          (QPDFParser *this,InputSource *input,
          shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
          *sp_description,string *object_description,Tokenizer *tokenizer,StringDecrypter *decrypter
          ,QPDF *context,bool parse_pdf,int stream_id,int obj_id)

{
  bool parse_pdf_local;
  StringDecrypter *decrypter_local;
  Tokenizer *tokenizer_local;
  string *object_description_local;
  shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
  *sp_description_local;
  InputSource *input_local;
  QPDFParser *this_local;
  
  this->input = input;
  this->object_description = object_description;
  this->tokenizer = tokenizer;
  this->decrypter = decrypter;
  this->context = context;
  std::
  shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
  ::shared_ptr(&this->description,sp_description);
  this->parse_pdf = parse_pdf;
  this->stream_id = stream_id;
  this->obj_id = obj_id;
  std::vector<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>::vector(&this->stack)
  ;
  this->frame = (StackFrame *)0x0;
  this->bad_count = 0;
  this->max_bad_count = 0xf;
  this->good_count = 0;
  this->start = 0;
  this->int_count = 0;
  this->int_buffer[0] = 0;
  this->int_buffer[1] = 0;
  this->last_offset_buffer[0] = 0;
  this->last_offset_buffer[1] = 0;
  return;
}

Assistant:

QPDFParser(
        InputSource& input,
        std::shared_ptr<QPDFObject::Description> sp_description,
        std::string const& object_description,
        qpdf::Tokenizer& tokenizer,
        QPDFObjectHandle::StringDecrypter* decrypter,
        QPDF* context,
        bool parse_pdf,
        int stream_id = 0,
        int obj_id = 0) :
        input(input),
        object_description(object_description),
        tokenizer(tokenizer),
        decrypter(decrypter),
        context(context),
        description(std::move(sp_description)),
        parse_pdf(parse_pdf),
        stream_id(stream_id),
        obj_id(obj_id)
    {
    }